

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate_foreach_macro.cpp
# Opt level: O2

void write_count(ostream *out,int max_count)

{
  ostream *poVar1;
  int i;
  int iVar2;
  
  poVar1 = std::operator<<(out,"\n/** Count the number of elements in the given __VA_ARGS__ */\n");
  poVar1 = std::operator<<(poVar1,"#define ");
  poVar1 = std::operator<<(poVar1,"MSERIALIZE_");
  poVar1 = std::operator<<(poVar1,"COUNT(...) ");
  poVar1 = std::operator<<(poVar1,"MSERIALIZE_");
  poVar1 = std::operator<<(poVar1,"EXPAND(");
  poVar1 = std::operator<<(poVar1,"MSERIALIZE_");
  std::operator<<(poVar1,"COUNT_I(__VA_ARGS__");
  iVar2 = max_count;
  while( true ) {
    if (iVar2 == 0) break;
    poVar1 = std::operator<<(out,',');
    std::ostream::operator<<((ostream *)poVar1,iVar2);
    iVar2 = iVar2 + -1;
  }
  poVar1 = std::operator<<(out,",x))\n");
  poVar1 = std::operator<<(poVar1,"#define ");
  poVar1 = std::operator<<(poVar1,"MSERIALIZE_");
  std::operator<<(poVar1,"COUNT_I(");
  for (iVar2 = 0; iVar2 <= max_count; iVar2 = iVar2 + 1) {
    poVar1 = std::operator<<(out,'a');
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,iVar2);
    std::operator<<(poVar1,',');
  }
  poVar1 = std::operator<<(out,"...) a");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,max_count);
  std::operator<<(poVar1,"\n");
  return;
}

Assistant:

void write_count(std::ostream& out, int max_count)
{
  out << "\n/** Count the number of elements in the given __VA_ARGS__ */\n"
      << "#define " << prefix << "COUNT(...) " << prefix << "EXPAND(" << prefix << "COUNT_I(__VA_ARGS__";
  for (int i = max_count; i != 0; --i)
  {
    out << ',' << i;
  }
  out << ",x))\n"
      << "#define " << prefix << "COUNT_I(";
  for (int i = 0; i < max_count+1; ++i)
  {
    out << 'a' << i << ',';
  }
  out << "...) a" << max_count << "\n";
}